

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
          (SOLHandler_Easy *this,VecReader<double> *rd)

{
  int iVar1;
  FILE *__x;
  VecReader<double> *in_RSI;
  VecReader<double> *in_RDI;
  size_type in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x13db68);
  std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000010,in_stack_00000008);
  while( true ) {
    iVar1 = VecReader<double>::Size(in_RSI);
    if (iVar1 == 0) break;
    __x = in_RDI[5].f_ + 0x48;
    VecReader<double>::ReadNext(in_RDI);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_RDI,(value_type_conflict *)__x);
  }
  return;
}

Assistant:

void OnDualSolution(VecReader& rd) {
    sol_.y_.clear();
    sol_.y_.reserve(header_.num_algebraic_cons
                    + header_.num_logical_cons);
    while (rd.Size())         // No permutation
      sol_.y_.push_back(rd.ReadNext());
  }